

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

ConstTokenOrSyntax * __thiscall
slang::syntax::ForeachLoopListSyntax::getChild(ForeachLoopListSyntax *this,size_t index)

{
  Token token;
  Token token_00;
  Token token_01;
  Token token_02;
  undefined8 in_RDX;
  long in_RSI;
  ConstTokenOrSyntax *in_RDI;
  SyntaxNode *in_stack_ffffffffffffff78;
  Info *in_stack_ffffffffffffff80;
  nullptr_t in_stack_ffffffffffffff88;
  
  switch(in_RDX) {
  case 0:
    token.info = in_stack_ffffffffffffff80;
    token._0_8_ = in_stack_ffffffffffffff78;
    ConstTokenOrSyntax::ConstTokenOrSyntax((ConstTokenOrSyntax *)0x71d06f,token);
    break;
  case 1:
    not_null<slang::syntax::NameSyntax_*>::get
              ((not_null<slang::syntax::NameSyntax_*> *)(in_RSI + 0x28));
    ConstTokenOrSyntax::ConstTokenOrSyntax
              ((ConstTokenOrSyntax *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    break;
  case 2:
    token_00.info = in_stack_ffffffffffffff80;
    token_00._0_8_ = in_stack_ffffffffffffff78;
    ConstTokenOrSyntax::ConstTokenOrSyntax((ConstTokenOrSyntax *)0x71d0bf,token_00);
    break;
  case 3:
    ConstTokenOrSyntax::ConstTokenOrSyntax
              ((ConstTokenOrSyntax *)(in_RSI + 0x40),in_stack_ffffffffffffff78);
    break;
  case 4:
    token_01.info = in_stack_ffffffffffffff80;
    token_01._0_8_ = in_stack_ffffffffffffff78;
    ConstTokenOrSyntax::ConstTokenOrSyntax((ConstTokenOrSyntax *)0x71d12c,token_01);
    break;
  case 5:
    token_02.info = in_stack_ffffffffffffff80;
    token_02._0_8_ = in_stack_ffffffffffffff78;
    ConstTokenOrSyntax::ConstTokenOrSyntax((ConstTokenOrSyntax *)0x71d15f,token_02);
    break;
  default:
    ConstTokenOrSyntax::ConstTokenOrSyntax(in_RDI,in_stack_ffffffffffffff88);
  }
  return in_RDI;
}

Assistant:

ConstTokenOrSyntax ForeachLoopListSyntax::getChild(size_t index) const {
    switch (index) {
        case 0: return openParen;
        case 1: return arrayName.get();
        case 2: return openBracket;
        case 3: return &loopVariables;
        case 4: return closeBracket;
        case 5: return closeParen;
        default: return nullptr;
    }
}